

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashBinGeneric.h
# Opt level: O3

IPAsKeyLRU * __thiscall
BinHash<IPAsKeyLRU>::DoInsert
          (BinHash<IPAsKeyLRU> *this,IPAsKeyLRU *key,bool need_alloc,bool *stored)

{
  uint uVar1;
  size_t sVar2;
  size_t __n;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  undefined4 extraout_var;
  IPAsKeyLRU **ppIVar6;
  size_t sVar7;
  IPAsKeyLRU *pIVar8;
  IPAsKeyLRU *pIVar9;
  
  *stored = false;
  uVar1 = this->tableSize;
  if (uVar1 == 0 || key == (IPAsKeyLRU *)0x0) {
LAB_00189315:
    key = (IPAsKeyLRU *)0x0;
  }
  else {
    uVar4 = (key->super_IPAsKey).hash;
    if (uVar4 == 0) {
      (key->super_IPAsKey).hash = 0xdeadbeef;
      sVar2 = (key->super_IPAsKey).addr_len;
      uVar4 = 0xdeadbeef;
      if (sVar2 != 0) {
        sVar7 = 0;
        do {
          uVar4 = (uint)(key->super_IPAsKey).addr[sVar7] + uVar4 * 0x65;
          (key->super_IPAsKey).hash = uVar4;
          sVar7 = sVar7 + 1;
        } while (sVar2 != sVar7);
      }
    }
    uVar3 = (ulong)uVar4 % (ulong)uVar1;
    ppIVar6 = this->hashBin;
    pIVar8 = ppIVar6[uVar3];
    if (pIVar8 != (IPAsKeyLRU *)0x0) {
      __n = (key->super_IPAsKey).addr_len;
      pIVar9 = pIVar8;
      do {
        if (((pIVar9->super_IPAsKey).addr_len == __n) &&
           (iVar5 = bcmp((pIVar9->super_IPAsKey).addr,(key->super_IPAsKey).addr,__n), iVar5 == 0)) {
          (*(pIVar9->super_IPAsKey)._vptr_IPAsKey[3])(pIVar9,key);
          *stored = false;
          return pIVar9;
        }
        pIVar9 = pIVar9->HashNext;
      } while (pIVar9 != (IPAsKeyLRU *)0x0);
    }
    if (need_alloc) {
      iVar5 = (*(key->super_IPAsKey)._vptr_IPAsKey[2])(key);
      key = (IPAsKeyLRU *)CONCAT44(extraout_var,iVar5);
      if (key == (IPAsKeyLRU *)0x0) goto LAB_00189315;
      ppIVar6 = this->hashBin;
      pIVar8 = ppIVar6[uVar3];
    }
    key->HashNext = pIVar8;
    ppIVar6[uVar3] = key;
    *stored = true;
    this->tableCount = this->tableCount + 1;
  }
  return key;
}

Assistant:

KeyObj * DoInsert(KeyObj * key, bool need_alloc, bool * stored)
    {
        KeyObj * retKey = NULL;

        *stored = false;

        if (key != NULL && tableSize > 0)
        {
            uint32_t hash_index = key->Hash() % tableSize;
            KeyObj * oldKey = hashBin[hash_index];

            while (oldKey != NULL && !key->IsSameKey(oldKey))
            {
                oldKey = oldKey->HashNext;
            }

            if (oldKey != NULL)
            {
                /* the keyed object is already in the table*/
                oldKey->Add(key);
                retKey = oldKey;
                *stored = false;
            }
            else
            {
                retKey = key;

                if (need_alloc)
                {
                    retKey = key->CreateCopy();
                }

                if (retKey != NULL)
                {
                    retKey->HashNext = hashBin[hash_index];
                    hashBin[hash_index] = retKey;
                    *stored = true;
                    tableCount++;
                }
            }
        }

        return retKey;
    }